

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  undefined8 uVar2;
  InetAddr local_140 [3];
  _func_void_shared_ptr<cube::http::HTTPConnection>_HTTPRequest_ptr *local_110;
  type local_108;
  RequestCallback local_f8;
  undefined1 local_d8 [8];
  HTTPServer http_server;
  InetAddr server_addr;
  
  signal(2,HandleSignal);
  cube::net::InetAddr::InetAddr((InetAddr *)&http_server.field_0xb4,0x2108);
  cube::http::HTTPServer::HTTPServer
            ((HTTPServer *)local_d8,&g_event_loop,(InetAddr *)&http_server.field_0xb4);
  local_110 = HelloHandler;
  std::
  bind<void(*)(std::shared_ptr<cube::http::HTTPConnection>,cube::http::HTTPRequest_const&),std::_Placeholder<1>const&,std::_Placeholder<2>const&>
            (&local_108,&local_110,(_Placeholder<1> *)&std::placeholders::_1,
             (_Placeholder<2> *)&std::placeholders::_2);
  std::function<void(std::shared_ptr<cube::http::HTTPConnection>,cube::http::HTTPRequest_const&)>::
  function<std::_Bind<void(*(std::_Placeholder<1>,std::_Placeholder<2>))(std::shared_ptr<cube::http::HTTPConnection>,cube::http::HTTPRequest_const&)>,void>
            ((function<void(std::shared_ptr<cube::http::HTTPConnection>,cube::http::HTTPRequest_const&)>
              *)&local_f8,&local_108);
  cube::http::HTTPServer::SetRequestCallback((HTTPServer *)local_d8,&local_f8);
  std::function<void_(std::shared_ptr<cube::http::HTTPConnection>,_const_cube::http::HTTPRequest_&)>
  ::~function(&local_f8);
  bVar1 = cube::http::HTTPServer::Start((HTTPServer *)local_d8);
  if (!bVar1) {
    __assert_fail("http_server.Start()",
                  "/workspace/llm4binary/github/license_c_cmakelists/yplusplus[P]cube/examples/http_svr/main.cpp"
                  ,0x29,"int main()");
  }
  cube::net::InetAddr::IpPort_abi_cxx11_(local_140);
  uVar2 = std::__cxx11::string::c_str();
  printf("http server start succ, listen addr=%s\n",uVar2);
  std::__cxx11::string::~string((string *)local_140);
  cube::net::EventLoop::Loop(&g_event_loop);
  cube::http::HTTPServer::~HTTPServer((HTTPServer *)local_d8);
  return 0;
}

Assistant:

int main() {
    signal(SIGINT, HandleSignal);

    InetAddr server_addr(8456);
    HTTPServer http_server(&g_event_loop, server_addr);
    //http_server.SetKeepAlive(true);
    http_server.SetRequestCallback(std::bind(&HelloHandler, _1, _2));
    assert(http_server.Start());
    printf("http server start succ, listen addr=%s\n", server_addr.IpPort().c_str());

    g_event_loop.Loop();

    return 0;
}